

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void show_existing_frame_reset(AV1Decoder *pbi,int existing_frame_idx)

{
  int in_ESI;
  AV1Decoder *in_RDI;
  int i;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  (in_RDI->common).current_frame.frame_type = '\0';
  (in_RDI->common).current_frame.refresh_frame_flags = 0xff;
  for (iVar1 = 0; iVar1 < 7; iVar1 = iVar1 + 1) {
    (in_RDI->common).remapped_ref_idx[iVar1] = -1;
  }
  if (in_RDI->need_resync != 0) {
    reset_ref_frame_map((AV1_COMMON *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    in_RDI->need_resync = 0;
  }
  (in_RDI->common).current_frame_id = (in_RDI->common).ref_frame_id[in_ESI];
  update_ref_frame_id(in_RDI);
  (in_RDI->common).features.refresh_frame_context = '\0';
  return;
}

Assistant:

static inline void show_existing_frame_reset(AV1Decoder *const pbi,
                                             int existing_frame_idx) {
  AV1_COMMON *const cm = &pbi->common;

  assert(cm->show_existing_frame);

  cm->current_frame.frame_type = KEY_FRAME;

  cm->current_frame.refresh_frame_flags = (1 << REF_FRAMES) - 1;

  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    cm->remapped_ref_idx[i] = INVALID_IDX;
  }

  if (pbi->need_resync) {
    reset_ref_frame_map(cm);
    pbi->need_resync = 0;
  }

  // Note that the displayed frame must be valid for referencing in order to
  // have been selected.
  cm->current_frame_id = cm->ref_frame_id[existing_frame_idx];
  update_ref_frame_id(pbi);

  cm->features.refresh_frame_context = REFRESH_FRAME_CONTEXT_DISABLED;
}